

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operators.h
# Opt level: O2

void __thiscall
pybind11::detail::
op_<(pybind11::detail::op_id)27,(pybind11::detail::op_type)0,pybind11::detail::self_t,pybind11::detail::self_t>
::execute<pybind11::class_<ImVec2>>
          (op_<(pybind11::detail::op_id)27,(pybind11::detail::op_type)0,pybind11::detail::self_t,pybind11::detail::self_t>
           *this,class_<ImVec2> *cl)

{
  is_operator local_9;
  _func_ImVec2_ptr_ImVec2_ptr_ImVec2_ptr *local_8;
  
  local_8 = op_impl<(pybind11::detail::op_id)27,_(pybind11::detail::op_type)0,_ImVec2,_ImVec2,_ImVec2>
            ::execute;
  class_<ImVec2>::def<ImVec2&(*)(ImVec2&,ImVec2_const&),pybind11::operator>
            ((def<ImVec2&(*)(ImVec2&,ImVec2_const&),pybind11 *)cl,"__iadd__",&local_8,&local_9);
  return;
}

Assistant:

void execute(Class &cl, const Extra&... extra) const {
        using Base = typename Class::type;
        using L_type = conditional_t<std::is_same<L, self_t>::value, Base, L>;
        using R_type = conditional_t<std::is_same<R, self_t>::value, Base, R>;
        using op = op_impl<id, ot, Base, L_type, R_type>;
        cl.def(op::name(), &op::execute, is_operator(), extra...);
        #if PY_MAJOR_VERSION < 3
        if (id == op_truediv || id == op_itruediv)
            cl.def(id == op_itruediv ? "__idiv__" : ot == op_l ? "__div__" : "__rdiv__",
                    &op::execute, is_operator(), extra...);
        #endif
    }